

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotTree.cpp
# Opt level: O3

void __thiscall
cali::SnapshotTree::SnapshotTreeImpl::SnapshotTreeImpl
          (SnapshotTreeImpl *this,Attribute *attr,Variant *value)

{
  _Rb_tree_header *p_Var1;
  anon_union_8_7_33918203_for_value aVar2;
  SnapshotTreeNode *pSVar3;
  
  pSVar3 = (SnapshotTreeNode *)operator_new(0xb8);
  (pSVar3->super_LockfreeIntrusiveTree<cali::SnapshotTreeNode>).m_me = pSVar3;
  (pSVar3->super_LockfreeIntrusiveTree<cali::SnapshotTreeNode>).m_node = 0x10;
  (pSVar3->m_treenode).parent = (SnapshotTreeNode *)0x0;
  (pSVar3->m_treenode).next = (SnapshotTreeNode *)0x0;
  (pSVar3->m_treenode).head._M_b._M_p = (__pointer_type)0x0;
  (pSVar3->m_label_key).m_node = attr->m_node;
  aVar2 = (value->m_v).value;
  (pSVar3->m_label_value).m_v.type_and_size = (value->m_v).type_and_size;
  (pSVar3->m_label_value).m_v.value = aVar2;
  (pSVar3->m_records).
  super__Vector_base<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>,_std::allocator<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pSVar3->m_records).
  super__Vector_base<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>,_std::allocator<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar3->m_records).
  super__Vector_base<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>,_std::allocator<std::vector<std::pair<cali::Attribute,_cali::Variant>,_std::allocator<std::pair<cali::Attribute,_cali::Variant>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(pSVar3->m_v_min)._M_t._M_impl.super__Rb_tree_header;
  (pSVar3->m_v_min)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar3->m_v_min)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pSVar3->m_v_min)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pSVar3->m_v_min)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pSVar3->m_v_min)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(pSVar3->m_v_max)._M_t._M_impl.super__Rb_tree_header;
  (pSVar3->m_v_max)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar3->m_v_max)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pSVar3->m_v_max)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pSVar3->m_v_max)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pSVar3->m_v_max)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_root = pSVar3;
  return;
}

Assistant:

SnapshotTreeImpl(const Attribute& attr, const Variant& value) : m_root(new SnapshotTreeNode(attr, value)) {}